

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::endSwitch(Builder *this,vector<spv::Block_*,_std::allocator<spv::Block_*>_> *param_1)

{
  bool bVar1;
  reference ppBVar2;
  Function *this_00;
  vector<spv::Block_*,_std::allocator<spv::Block_*>_> *param_1_local;
  Builder *this_local;
  
  bVar1 = Block::isTerminated(this->buildPoint);
  if (!bVar1) {
    addSwitchBreak(this,true);
  }
  ppBVar2 = std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::top
                      (&this->switchMerges);
  this_00 = Block::getParent(*ppBVar2);
  ppBVar2 = std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::top
                      (&this->switchMerges);
  spv::Function::addBlock(this_00,*ppBVar2);
  ppBVar2 = std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::top
                      (&this->switchMerges);
  setBuildPoint(this,*ppBVar2);
  std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::pop
            (&this->switchMerges);
  return;
}

Assistant:

void Builder::endSwitch(std::vector<Block*>& /*segmentBlock*/)
{
    // Close out previous segment by jumping, if necessary, to next segment
    if (! buildPoint->isTerminated())
        addSwitchBreak(true);

    switchMerges.top()->getParent().addBlock(switchMerges.top());
    setBuildPoint(switchMerges.top());

    switchMerges.pop();
}